

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskflow.hpp
# Opt level: O0

void __thiscall tf::Taskflow::_dump(Taskflow *this,ostream *os,Node *node,Dumper *dumper)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  const_reference ppNVar4;
  char *pcVar5;
  add_pointer_t<const_tf::Node::Subflow> ptVar6;
  int __c;
  int __c_00;
  int extraout_EDX;
  int extraout_EDX_00;
  void *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar7;
  ostream *in_RSI;
  char *pcVar8;
  Graph *sbg;
  size_t s;
  ostream *in_stack_ffffffffffffffb8;
  Node *in_stack_ffffffffffffffc0;
  ulong local_28;
  
  poVar2 = std::operator<<(in_RSI,'p');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_RDX);
  std::operator<<(poVar2,"[label=\"");
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::operator<<(in_RSI,(string *)((long)in_RDX + 8));
  }
  else {
    poVar2 = std::operator<<(in_RSI,'p');
    std::ostream::operator<<(poVar2,in_RDX);
  }
  pcVar8 = "\" ";
  std::operator<<(in_RSI,"\" ");
  pcVar8 = std::
           variant<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           ::index((variant<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    *)((long)in_RDX + 0x88),pcVar8,__c);
  if (pcVar8 + -4 < (char *)0x2) {
    std::operator<<(in_RSI,"shape=diamond color=black fillcolor=aquamarine style=filled");
  }
  pcVar8 = "];\n";
  std::operator<<(in_RSI,"];\n");
  uVar7 = extraout_RDX;
  for (local_28 = 0; __c_00 = (int)uVar7, local_28 < *(ulong *)((long)in_RDX + 0x40);
      local_28 = local_28 + 1) {
    bVar1 = Node::_is_conditioner(in_stack_ffffffffffffffc0);
    if (bVar1) {
      poVar2 = std::operator<<(in_RSI,'p');
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_RDX);
      in_stack_ffffffffffffffc0 = (Node *)std::operator<<(poVar2," -> p");
      ppNVar4 = SmallVectorTemplateCommon<tf::Node_*,_void>::operator[]
                          ((SmallVectorTemplateCommon<tf::Node_*,_void> *)in_stack_ffffffffffffffc0,
                           (size_type)in_stack_ffffffffffffffb8);
      poVar2 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffffc0,*ppNVar4);
      poVar2 = std::operator<<(poVar2," [style=dashed label=\"");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_28);
      pcVar8 = "\"];\n";
      std::operator<<(poVar2,"\"];\n");
      uVar7 = extraout_RDX_00;
    }
    else {
      poVar2 = std::operator<<(in_RSI,'p');
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_RDX);
      in_stack_ffffffffffffffb8 = std::operator<<(poVar2," -> p");
      ppNVar4 = SmallVectorTemplateCommon<tf::Node_*,_void>::operator[]
                          ((SmallVectorTemplateCommon<tf::Node_*,_void> *)in_stack_ffffffffffffffc0,
                           (size_type)in_stack_ffffffffffffffb8);
      poVar2 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffffb8,*ppNVar4);
      pcVar8 = ";\n";
      std::operator<<(poVar2,";\n");
      uVar7 = extraout_RDX_01;
    }
  }
  if (((*(long *)((long)in_RDX + 0x38) != 0) &&
      (pcVar5 = std::
                variant<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                ::index((variant<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                         *)(*(long *)((long)in_RDX + 0x38) + 0x88),pcVar8,__c_00),
      __c_00 = extraout_EDX, pcVar5 == (char *)0x3)) && (*(long *)((long)in_RDX + 0x40) == 0)) {
    poVar2 = std::operator<<(in_RSI,'p');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_RDX);
    poVar2 = std::operator<<(poVar2," -> p");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(void **)((long)in_RDX + 0x38));
    pcVar8 = " [style=dashed color=blue];\n";
    std::operator<<(poVar2," [style=dashed color=blue];\n");
    __c_00 = extraout_EDX_00;
  }
  pcVar8 = std::
           variant<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           ::index((variant<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    *)((long)in_RDX + 0x88),pcVar8,__c_00);
  if (pcVar8 == (char *)0x3) {
    ptVar6 = std::
             get_if<tf::Node::Subflow,std::monostate,tf::Node::Static,tf::Node::Runtime,tf::Node::Subflow,tf::Node::Condition,tf::Node::MultiCondition,tf::Node::Module,tf::Node::Async,tf::Node::DependentAsync>
                       ((variant<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                         *)0x1328ee);
    bVar1 = std::
            vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ::empty(&(ptVar6->subgraph).
                     super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                   );
    if (!bVar1) {
      poVar2 = std::operator<<(in_RSI,"subgraph cluster_p");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_RDX);
      std::operator<<(poVar2," {\nlabel=\"Subflow: ");
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::operator<<(in_RSI,(string *)((long)in_RDX + 8));
      }
      else {
        poVar2 = std::operator<<(in_RSI,'p');
        std::ostream::operator<<(poVar2,in_RDX);
      }
      poVar2 = std::operator<<(in_RSI,"\";\n");
      std::operator<<(poVar2,"color=blue\n");
      _dump(this,os,(Graph *)node,dumper);
      std::operator<<(in_RSI,"}\n");
    }
  }
  return;
}

Assistant:

inline void Taskflow::_dump(
  std::ostream& os, const Node* node, Dumper& dumper
) const {

  // label of the node
  os << 'p' << node << "[label=\"";
  if(node->_name.empty()) os << 'p' << node;
  else os << node->_name;
  os << "\" ";

  // shape of the node
  switch(node->_handle.index()) {

    case Node::CONDITION:
    case Node::MULTI_CONDITION:
      os << "shape=diamond color=black fillcolor=aquamarine style=filled";
    break;

    default:
    break;
  }

  os << "];\n";

  for(size_t s=0; s<node->_num_successors; ++s) {
    if(node->_is_conditioner()) {
      // case edge is dashed
      os << 'p' << node << " -> p" << node->_edges[s]
         << " [style=dashed label=\"" << s << "\"];\n";
    } else {
      os << 'p' << node << " -> p" << node->_edges[s] << ";\n";
    }
  }

  // subflow join node
  if(node->_parent && node->_parent->_handle.index() == Node::SUBFLOW &&
     node->_num_successors == 0
    ) {
    os << 'p' << node << " -> p" << node->_parent << " [style=dashed color=blue];\n";
  }

  // node info
  switch(node->_handle.index()) {

    case Node::SUBFLOW: {
      auto& sbg = std::get_if<Node::Subflow>(&node->_handle)->subgraph;
      if(!sbg.empty()) {
        os << "subgraph cluster_p" << node << " {\nlabel=\"Subflow: ";
        if(node->_name.empty()) os << 'p' << node;
        else os << node->_name;

        os << "\";\n" << "color=blue\n";
        _dump(os, &sbg, dumper);
        os << "}\n";
      }
    }
    break;

    default:
    break;
  }
}